

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_XO.cpp
# Opt level: O2

void example::learning_XO(void)

{
  longdouble **pplVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble lVar6;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 adaptiveLearningRate [16];
  tensor ppplVar7;
  tensor ppplVar8;
  tensor ppplVar9;
  ostream *poVar10;
  Convolution2D *pCVar11;
  FullyConnected *this;
  Loss *this_00;
  int y;
  int iVar12;
  int x;
  uint uVar13;
  long lVar14;
  char *__to;
  int iVar15;
  long lVar16;
  Layer *layer;
  uint uVar17;
  int y_2;
  int iVar18;
  int y_1;
  int iVar19;
  undefined2 in_stack_ffffffffffffff22;
  undefined4 in_stack_ffffffffffffff24;
  undefined6 in_stack_ffffffffffffff32;
  tensor in [2];
  tensor out [2];
  SequentialModule module;
  
  ppplVar7 = type::createTensor(8,8,1);
  in[0] = ppplVar7;
  ppplVar8 = type::createTensor(8,8,1);
  iVar15 = 2;
  in[1] = ppplVar8;
  ppplVar9 = type::createTensor(2,1,1);
  out[0] = ppplVar9;
  out[1] = type::createTensor(2,1,1);
  pplVar1 = *ppplVar7;
  lVar16 = 0;
  lVar6 = (longdouble)1;
  for (lVar14 = 7; lVar14 != -1; lVar14 = lVar14 + -1) {
    *(longdouble *)(*(long *)((long)pplVar1 + lVar16) + lVar16 * 2) = lVar6;
    *(longdouble *)((long)pplVar1[lVar14] + lVar16 * 2) = lVar6;
    lVar16 = lVar16 + 8;
  }
  plVar2 = **ppplVar9;
  *plVar2 = lVar6;
  plVar2[1] = (longdouble)0;
  iVar12 = 3;
  uVar13 = 0;
  do {
    if (iVar12 < (int)uVar13) {
      plVar2 = **out[1];
      *plVar2 = (longdouble)0;
      plVar2[1] = lVar6;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
          poVar10 = std::ostream::_M_insert<long_double>
                              (*(longdouble *)((long)(*ppplVar7)[lVar14] + lVar16));
          std::operator<<(poVar10,' ');
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      std::operator<<((ostream *)&std::cout,'\n');
      std::operator<<((ostream *)&std::cout,'\n');
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
          poVar10 = std::ostream::_M_insert<long_double>
                              (*(longdouble *)((long)(*ppplVar8)[lVar14] + lVar16));
          std::operator<<(poVar10,' ');
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      ::module::SequentialModule::SequentialModule(&module);
      acceptableError._10_2_ = in_stack_ffffffffffffff22;
      acceptableError._0_10_ = (longdouble)0.001;
      acceptableError._12_4_ = in_stack_ffffffffffffff24;
      ::module::SequentialModule::setStopParameter(&module,500,(scalar)acceptableError);
      learningRate._10_2_ = in_stack_ffffffffffffff22;
      learningRate._0_10_ = (longdouble)0.2;
      learningRate._12_4_ = in_stack_ffffffffffffff24;
      adaptiveLearningRate._10_6_ = in_stack_ffffffffffffff32;
      adaptiveLearningRate._0_10_ = (longdouble)1e-10;
      ::module::SequentialModule::setTrainingParameter
                (&module,(scalar)learningRate,(scalar)adaptiveLearningRate);
      ::module::SequentialModule::setInput(&module,8,8,1);
      pCVar11 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar11,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&module,(Layer *)pCVar11);
      pCVar11 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar11,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&module,(Layer *)pCVar11);
      this = (FullyConnected *)operator_new(0x78);
      ::layer::FullyConnected::FullyConnected(this,8,2,true);
      ::module::SequentialModule::add(&module,(Layer *)this);
      this_00 = (Loss *)operator_new(0x88);
      ::layer::Loss::Loss(this_00,2,2,2,true);
      layer = (Layer *)((long)&this_00->_vptr_Loss + (long)this_00->_vptr_Loss[-3]);
      ::module::SequentialModule::add(&module,layer);
      ::module::SequentialModule::link(&module,(char *)layer,__to);
      poVar10 = std::operator<<((ostream *)&std::cout,'a');
      std::endl<char,std::char_traits<char>>(poVar10);
      ::module::SequentialModule::training(&module,in,out,2,1.0);
      poVar10 = std::operator<<((ostream *)&std::cout,'b');
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,"- Resulta: ");
      std::endl<char,std::char_traits<char>>(poVar10);
      ::module::SequentialModule::predict(&module,in[0]);
      std::operator<<((ostream *)&std::cout,"  X : ");
      ppplVar7 = ::module::SequentialModule::getOut(&module);
      poVar10 = std::ostream::_M_insert<long_double>(***ppplVar7);
      std::operator<<(poVar10,", ");
      ppplVar7 = ::module::SequentialModule::getOut(&module);
      poVar10 = std::ostream::_M_insert<long_double>((**ppplVar7)[1]);
      std::endl<char,std::char_traits<char>>(poVar10);
      ::module::SequentialModule::predict(&module,in[1]);
      std::operator<<((ostream *)&std::cout,"  O : ");
      ppplVar7 = ::module::SequentialModule::getOut(&module);
      poVar10 = std::ostream::_M_insert<long_double>(***ppplVar7);
      std::operator<<(poVar10,", ");
      ppplVar7 = ::module::SequentialModule::getOut(&module);
      poVar10 = std::ostream::_M_insert<long_double>((**ppplVar7)[1]);
      std::endl<char,std::char_traits<char>>(poVar10);
      ::module::SequentialModule::~SequentialModule(&module);
      return;
    }
    pplVar1 = *ppplVar8;
    plVar2 = pplVar1[(long)(int)uVar13 + 4];
    lVar16 = (long)(int)uVar13 + 4;
    lVar14 = (long)iVar12 + 4;
    plVar2[lVar14] = lVar6;
    plVar3 = pplVar1[(long)iVar12 + 4];
    plVar3[lVar16] = lVar6;
    iVar18 = 4 - uVar13;
    plVar4 = pplVar1[iVar18];
    plVar4[lVar14] = lVar6;
    iVar19 = 4 - iVar12;
    plVar5 = pplVar1[iVar19];
    plVar5[lVar16] = lVar6;
    plVar2[iVar19] = lVar6;
    plVar3[iVar18] = lVar6;
    plVar4[iVar19] = lVar6;
    plVar5[iVar18] = lVar6;
    if (SBORROW4(iVar15,uVar13 * 2) == (int)(iVar15 + uVar13 * -2) < 0) {
      uVar17 = ~(uVar13 * 2);
LAB_00104ab2:
      uVar13 = uVar13 + 1;
    }
    else {
      if (iVar12 * -2 + 6 <= iVar15) {
        uVar17 = (~uVar13 + iVar12) * 2;
        iVar12 = iVar12 + -1;
        goto LAB_00104ab2;
      }
      uVar17 = iVar12 * 2 - 1;
      iVar12 = iVar12 + -1;
    }
    iVar15 = iVar15 + uVar17;
  } while( true );
}

Assistant:

void learning_XO()
    {
        type::tensor in[2];
        in[0] = type::createTensor(8, 8, 1);
        in[1] = type::createTensor(8, 8, 1);

        type::tensor out[2];
        out[0] = type::createTensor(2, 1, 1);
        out[1] = type::createTensor(2, 1, 1);

        for(int i(0); i < 8; i++){
            (*in[0])[i][i] = 1;
            (*in[0])[7 - i][i] = 1;
        }
        (**out[0])[0] = 1;
        (**out[0])[1] = 0;

        {
            int x = 0;
            int y = 3;
            int d = 3 - 1;
            while (y >= x)
            {
                (*in[1])[4 + x][4 + y] = 1;
                (*in[1])[4 + y][4 + x] = 1;
                (*in[1])[4 - x][4 + y] = 1;
                (*in[1])[4 - y][4 + x] = 1;
                (*in[1])[4 + x][4 - y] = 1;
                (*in[1])[4 + y][4 - x] = 1;
                (*in[1])[4 - x][4 - y] = 1;
                (*in[1])[4 - y][4 - x] = 1;

                if (d >= 2 * x)
                {
                    d -= 2 * x + 1;
                    x++;
                }
                else if (d < 2 * (3 - y))
                {
                    d += 2 * y - 1;
                    y--;
                }
                else
                {
                    d += 2 * (y - x - 1);
                    y--;
                    x++;
                }
            }
        }
        (**out[1])[0] = 0;
        (**out[1])[1] = 1;

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[0])[y][x] << ' ';
            }
            std::cout << '\n';
        }
        std::cout << '\n';
        std::cout << '\n';

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[1])[y][x] << ' ';
            }
            std::cout << '\n';
        }

        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule module;
        module.setStopParameter(500, 0.001);
        module.setTrainingParameter(0.2, 0.0000000001);
        module.setInput(8, 8, 1);
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::FullyConnected(8, ACTIVATION_SIGMOIDE, true));
        module.add(new layer::Loss(2, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        module.link();

        std::cout << 'a' << std::endl;
        module.training(in, out, 2, 1);
        std::cout << 'b' << std::endl;

        std::cout << "- Resulta: " << std::endl;
        module.predict(in[0]);
        std::cout << "  X : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;
        module.predict(in[1]);
        std::cout << "  O : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;



    }